

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3MemSize(void *pPrior)

{
  sqlite3_int64 *p;
  void *pPrior_local;
  
  if (pPrior == (void *)0x0) {
    pPrior_local._4_4_ = 0;
  }
  else {
    pPrior_local._4_4_ = (int)*(undefined8 *)((long)pPrior + -8);
  }
  return pPrior_local._4_4_;
}

Assistant:

static int sqlite3MemSize(void *pPrior){
#ifdef SQLITE_MALLOCSIZE
  return pPrior ? (int)SQLITE_MALLOCSIZE(pPrior) : 0;
#else
  sqlite3_int64 *p;
  if( pPrior==0 ) return 0;
  p = (sqlite3_int64*)pPrior;
  p--;
  return (int)p[0];
#endif
}